

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O2

Path * Pathie::Path::global_cache_dir(Path *__return_storage_ptr__,localpathtype local)

{
  allocator local_49;
  string local_48;
  string local_28;
  
  if ((local == LOCALPATH_LOCAL) ||
     ((local == LOCALPATH_DEFAULT && (c_localdefault == LOCALPATH_LOCAL)))) {
    std::__cxx11::string::string((string *)&local_28,"/var/local/cache",&local_49);
    Path(__return_storage_ptr__,&local_28);
    std::__cxx11::string::_M_dispose();
  }
  else {
    std::__cxx11::string::string((string *)&local_48,"/var/cache",&local_49);
    Path(__return_storage_ptr__,&local_48);
    std::__cxx11::string::_M_dispose();
  }
  return __return_storage_ptr__;
}

Assistant:

Path Path::global_cache_dir(localpathtype local)
{
#if defined(_PATHIE_UNIX)
 if (local == Path::LOCALPATH_LOCAL || (local == Path::LOCALPATH_DEFAULT && get_global_dir_default() == Path::LOCALPATH_LOCAL))
    return Path("/var/local/cache");
  else
    return Path("/var/cache");
#elif defined(_WIN32)
  return global_mutable_data_dir();
#else
#error Unsupported system.
#endif
}